

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O0

bool __thiscall
rcdiscover::Discover::getResponse
          (Discover *this,
          vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *info,
          int timeout_per_socket)

{
  bool bVar1;
  reference this_00;
  int in_EDX;
  DeviceInfo *in_RSI;
  long in_RDI;
  future<rcdiscover::DeviceInfo> *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  *__range1_1;
  bool ret;
  SocketLinux *socket;
  iterator __end1;
  iterator __begin1;
  vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *__range1;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  futures;
  vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
  *req_nums;
  timeval tv;
  undefined6 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  DeviceInfo *in_stack_fffffffffffffe30;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  *in_stack_fffffffffffffe40;
  future<rcdiscover::DeviceInfo> *in_stack_fffffffffffffe58;
  type *in_stack_fffffffffffffea0;
  launch in_stack_fffffffffffffeac;
  __normal_iterator<std::future<rcdiscover::DeviceInfo>_*,_std::vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>_>
  local_b0;
  undefined1 *local_a8;
  byte local_9d;
  reference local_90;
  long *local_88;
  long local_80;
  reference local_68;
  SocketLinux *local_60;
  __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
  local_58 [2];
  undefined1 local_48 [24];
  long local_30;
  long local_28;
  long local_20;
  DeviceInfo *local_10;
  
  local_28 = (long)(in_EDX / 1000);
  local_20 = (long)((in_EDX % 1000) * 1000);
  local_30 = in_RDI + 0x18;
  local_10 = in_RSI;
  std::
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ::vector((vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
            *)0x11db42);
  local_58[0]._M_current =
       (SocketLinux *)
       std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::begin
                 ((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                  CONCAT17(in_stack_fffffffffffffe2f,
                           CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
  local_60 = (SocketLinux *)
             std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::end
                       ((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *
                        )CONCAT17(in_stack_fffffffffffffe2f,
                                  CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe2f,
                                   CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
               ::operator*(local_58);
    local_88 = &local_28;
    local_80 = local_30;
    local_68 = local_90;
    std::
    async<rcdiscover::Discover::getResponse(std::vector<rcdiscover::DeviceInfo,std::allocator<rcdiscover::DeviceInfo>>&,int)::__0>
              (in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
    std::
    vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
    ::push_back((vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
                 *)in_stack_fffffffffffffe30,
                (value_type *)
                CONCAT17(in_stack_fffffffffffffe2f,
                         CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
    std::future<rcdiscover::DeviceInfo>::~future((future<rcdiscover::DeviceInfo> *)0x11dc1c);
    __gnu_cxx::
    __normal_iterator<rcdiscover::SocketLinux_*,_std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>_>
    ::operator++(local_58);
  }
  local_9d = 0;
  local_a8 = local_48;
  local_b0._M_current =
       (future<rcdiscover::DeviceInfo> *)
       std::
       vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
       ::begin((vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
                *)CONCAT17(in_stack_fffffffffffffe2f,
                           CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
  std::
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ::end((vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
         *)CONCAT17(in_stack_fffffffffffffe2f,
                    CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::future<rcdiscover::DeviceInfo>_*,_std::vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<std::future<rcdiscover::DeviceInfo>_*,_std::vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe2f,
                                   CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::future<rcdiscover::DeviceInfo>_*,_std::vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>_>
    ::operator*(&local_b0);
    in_stack_fffffffffffffe30 = local_10;
    std::future<rcdiscover::DeviceInfo>::get(in_stack_fffffffffffffe58);
    std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::push_back
              ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
               in_stack_fffffffffffffe30,
               (value_type *)
               CONCAT17(in_stack_fffffffffffffe2f,
                        CONCAT16(in_stack_fffffffffffffe2e,in_stack_fffffffffffffe28)));
    DeviceInfo::~DeviceInfo(in_stack_fffffffffffffe30);
    this_00 = std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::back
                        ((vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *)
                         in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe2f = DeviceInfo::isValid(this_00);
    local_9d = (local_9d & 1) != 0 || (bool)in_stack_fffffffffffffe2f;
    __gnu_cxx::
    __normal_iterator<std::future<rcdiscover::DeviceInfo>_*,_std::vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>_>
    ::operator++(&local_b0);
  }
  std::
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ::~vector(in_stack_fffffffffffffe40);
  return (bool)(local_9d & 1);
}

Assistant:

bool Discover::getResponse(std::vector<DeviceInfo> &info,
                           int timeout_per_socket)
{
  // setup waiting for data to arrive

  struct timeval tv;
  tv.tv_sec=timeout_per_socket/1000;
  tv.tv_usec=(timeout_per_socket%1000)*1000;

  // try to get a valid package (repeat if an invalid package is received)

  const auto &req_nums = req_nums_;

  std::vector<std::future<DeviceInfo>> futures;
  for (auto &socket : sockets_)
  {
    futures.push_back(std::async(std::launch::async, [&socket, &tv, &req_nums]
    {
      DeviceInfo device_info(socket.getIfaceName());
      device_info.clear();

      int count = 10;

      auto sock = socket.getHandle<typename SocketType::SocketType>();

      fd_set fds;
      FD_ZERO(&fds);
      FD_SET(sock, &fds);

      while (!device_info.isValid() && count > 0)
      {
        count--;

        if (select(static_cast<int>(sock+1), &fds, NULL, NULL, &tv) > 0)
        {
          // get package

          uint8_t p[600];

          struct sockaddr_in addr;
#ifdef WIN32
          int naddr = sizeof(addr);
#else
          socklen_t naddr = sizeof(addr);
#endif
          memset(&addr, 0, naddr);

          long n = recvfrom(sock,
                            reinterpret_cast<char *>(p), sizeof(p), 0,
                            reinterpret_cast<struct sockaddr *>(&addr), &naddr);

          // check if received package is a valid discovery acknowledge

          if (n >= 8)
          {
            if (p[0] == 0 && p[1] == 0 && p[2] == 0 &&
                p[3] == 0x03)
            {
              if (std::find(req_nums.begin(), req_nums.end(),
                            std::make_tuple(p[6], p[7])) != req_nums.end())
              {
                size_t len=(static_cast<size_t>(p[4])<<8)|p[5];

                if (static_cast<size_t>(n) >= len+8)
                {
                  // extract information and store in list

                  device_info.set(p+8, len);
                }
              }
            }
          }
        }
        else
        {
          count=0;
        }
      }

      return device_info;
    }));

  }

  bool ret = false;
  for (auto &f : futures)
  {
    info.push_back(f.get());
    ret |= info.back().isValid();
  }

  return ret;
}